

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddIte.c
# Opt level: O2

DdNode * Cudd_bddXor(DdManager *dd,DdNode *f,DdNode *g)

{
  DdNode *pDVar1;
  
  do {
    dd->reordered = 0;
    pDVar1 = cuddBddXorRecur(dd,f,g);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode *
Cudd_bddXor(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    DdNode *res;

    do {
        dd->reordered = 0;
        res = cuddBddXorRecur(dd,f,g);
    } while (dd->reordered == 1);
    return(res);

}